

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O0

void SharpYuvFilterRow_SSE2
               (int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  int in_R9D;
  int in_stack_00000174;
  uint16_t *in_stack_00000178;
  uint16_t *in_stack_00000180;
  int in_stack_0000018c;
  int16_t *in_stack_00000190;
  int16_t *in_stack_00000198;
  int in_stack_000001a4;
  uint16_t *in_stack_000001a8;
  uint16_t *in_stack_000001b0;
  int in_stack_000001bc;
  int16_t *in_stack_000001c0;
  int16_t *in_stack_000001c8;
  
  if (in_R9D < 0xb) {
    SharpYuvFilterRow16_SSE2
              (in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,
               in_stack_000001a8,in_stack_000001a4);
  }
  else {
    SharpYuvFilterRow32_SSE2
              (in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000180,
               in_stack_00000178,in_stack_00000174);
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out,
                                   int bit_depth) {
  if (bit_depth <= 10) {
    SharpYuvFilterRow16_SSE2(A, B, len, best_y, out, bit_depth);
  } else {
    SharpYuvFilterRow32_SSE2(A, B, len, best_y, out, bit_depth);
  }
}